

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_make_path_table_2(archive_write *a,vdd *vdd,int depth,int *dir_number)

{
  vdd_type vVar1;
  int iVar2;
  isoent **__base;
  path_table *ppVar3;
  int local_4c;
  int i;
  path_table *pt;
  isoent **enttbl;
  isoent *np;
  int *dir_number_local;
  int depth_local;
  vdd *vdd_local;
  archive_write *a_local;
  
  ppVar3 = vdd->pathtbl + depth;
  if (ppVar3->cnt == 0) {
    ppVar3->sorted = (isoent **)0x0;
    return 0;
  }
  pt = (path_table *)malloc((long)ppVar3->cnt << 3);
  if (pt == (path_table *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
    return -0x1e;
  }
  ppVar3->sorted = (isoent **)pt;
  for (enttbl = (isoent **)ppVar3->first; enttbl != (isoent **)0x0; enttbl = (isoent **)enttbl[0x10]
      ) {
    pt->first = (isoent *)enttbl;
    pt = (path_table *)&pt->last;
  }
  __base = ppVar3->sorted;
  vVar1 = vdd->vdd_type;
  if (vVar1 != VDD_PRIMARY) {
    if (vVar1 == VDD_JOLIET) {
      qsort(__base,(long)ppVar3->cnt,8,_compare_path_table_joliet);
      goto LAB_00b27670;
    }
    if (vVar1 != VDD_ENHANCED) goto LAB_00b27670;
  }
  qsort(__base,(long)ppVar3->cnt,8,_compare_path_table);
LAB_00b27670:
  for (local_4c = 0; local_4c < ppVar3->cnt; local_4c = local_4c + 1) {
    iVar2 = *dir_number;
    *dir_number = iVar2 + 1;
    __base[local_4c]->dir_number = iVar2;
  }
  return 0;
}

Assistant:

static int
isoent_make_path_table_2(struct archive_write *a, struct vdd *vdd,
    int depth, int *dir_number)
{
	struct isoent *np;
	struct isoent **enttbl;
	struct path_table *pt;
	int i;

	pt = &vdd->pathtbl[depth];
	if (pt->cnt == 0) {
		pt->sorted = NULL;
		return (ARCHIVE_OK);
	}
	enttbl = malloc(pt->cnt * sizeof(struct isoent *));
	if (enttbl == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	pt->sorted = enttbl;
	for (np = pt->first; np != NULL; np = np->ptnext)
		*enttbl ++ = np;
	enttbl = pt->sorted;

	switch (vdd->vdd_type) {
	case VDD_PRIMARY:
	case VDD_ENHANCED:
#ifdef __COMPAR_FN_T
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    (__compar_fn_t)_compare_path_table);
#else
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    _compare_path_table);
#endif
		break;
	case VDD_JOLIET:
#ifdef __COMPAR_FN_T
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    (__compar_fn_t)_compare_path_table_joliet);
#else
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    _compare_path_table_joliet);
#endif
		break;
	}
	for (i = 0; i < pt->cnt; i++)
		enttbl[i]->dir_number = (*dir_number)++;

	return (ARCHIVE_OK);
}